

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Worker.cpp
# Opt level: O2

string * __thiscall Worker::ReplaceRNUMEx(string *__return_storage_ptr__,Worker *this,string *in)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  string to;
  string from;
  random_device rd;
  char *local_1418;
  undefined8 local_1410;
  char local_1408 [16];
  string local_13f8 [32];
  string local_13d8;
  random_device local_13b8;
  
  std::random_device::random_device(&local_13b8);
  std::__cxx11::string::string(local_13f8,"$RNUM(",(allocator *)&local_1418);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)in);
  uVar2 = std::__cxx11::string::find((string *)__return_storage_ptr__,(ulong)local_13f8);
  while (uVar2 != 0xffffffffffffffff) {
    lVar3 = std::__cxx11::string::find((char *)__return_storage_ptr__,0x10837d);
    std::__cxx11::string::substr((ulong)&local_1418,(ulong)__return_storage_ptr__);
    uVar1 = atoi(local_1418);
    std::__cxx11::string::~string((string *)&local_1418);
    local_1418 = local_1408;
    local_1410 = 0;
    local_1408[0] = '\0';
    if ((int)uVar1 < 1) {
      std::__cxx11::string::assign((char *)&local_1418);
    }
    else {
      uVar4 = std::random_device::_M_getval();
      std::__cxx11::to_string(&local_13d8,(uint)((uVar4 & 0xffffffff) % (ulong)uVar1));
      std::__cxx11::string::operator=((string *)&local_1418,(string *)&local_13d8);
      std::__cxx11::string::~string((string *)&local_13d8);
    }
    std::__cxx11::string::replace
              ((ulong)__return_storage_ptr__,uVar2,(string *)((lVar3 - uVar2) + 1));
    uVar2 = std::__cxx11::string::find((string *)__return_storage_ptr__,(ulong)local_13f8);
    std::__cxx11::string::~string((string *)&local_1418);
  }
  std::__cxx11::string::~string(local_13f8);
  std::random_device::~random_device(&local_13b8);
  return __return_storage_ptr__;
}

Assistant:

string Worker::ReplaceRNUMEx(const string in) {
    random_device rd;

    string from = "$RNUM(";
    string subject = in;
    string::size_type s_pos = subject.find(from);

    while (s_pos != string::npos) {
        string::size_type e_pos = subject.find(")", s_pos);
        int m = atoi(subject.substr(s_pos + from.size(), e_pos).c_str());
        string to;
        if (m > 0) {
            to = to_string(rd() % m);
        }else{
            to = "";
        }
        subject.replace(s_pos, e_pos - s_pos +1, to);
        s_pos = subject.find(from, s_pos + to.size());
    }

    return subject;
}